

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

void __thiscall
Graph<Node>::printShortestPath(Graph<Node> *this,ofstream *fout,int *node1,int *node2)

{
  undefined8 in_RAX;
  ostream *poVar1;
  int iVar2;
  int iVar3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"Shortest path between ",0x16);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)fout,*node1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," and ",5);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,*node2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":\n\n",3);
  if ((this->minDist).vect[*node1].vect[*node2] == -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"DOES NOT EXIST",0xe);
  }
  else {
    iVar2 = *node1;
    iVar3 = *node2;
    if (iVar2 != iVar3) {
      do {
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)fout,iVar2);
        uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_38 + 7),1);
        iVar3 = *node2;
        iVar2 = (this->nextNodeInPath).vect[iVar2].vect[iVar3];
      } while (iVar2 != iVar3);
    }
    fout = (ofstream *)std::ostream::operator<<((ostream *)fout,iVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,"\n------------------------\n\n",0x1b);
  return;
}

Assistant:

void printShortestPath(std::ofstream &fout, const int &node1, const int &node2) {
        fout << "Shortest path between " << node1 << " and " << node2 << ":\n\n";
        if (minDist[node1][node2] == -1) {
            fout << "DOES NOT EXIST";
            fout << "\n------------------------\n\n";
            return;
        }

        int currNode = node1;
        while (currNode != node2) {
            fout << currNode << ' ';
            currNode = nextNodeInPath[currNode][node2];
        }

        fout << node2 << "\n------------------------\n\n";
    }